

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.cpp
# Opt level: O2

void __thiscall jrtplib::RTPPacket::Clear(RTPPacket *this)

{
  this->hasextension = false;
  this->hasmarker = false;
  this->numcsrcs = 0;
  this->payloadtype = '\0';
  this->extseqnr = 0;
  this->timestamp = 0;
  this->ssrc = 0;
  this->error = 0;
  this->extid = 0;
  this->packet = (uint8_t *)0x0;
  this->payload = (uint8_t *)0x0;
  this->packetlength = 0;
  this->payloadlength = 0;
  this->extension = (uint8_t *)0x0;
  this->extensionlength = 0;
  this->externalbuffer = false;
  return;
}

Assistant:

void RTPPacket::Clear()
{
	hasextension = false;
	hasmarker = false;
	numcsrcs = 0;
	payloadtype = 0;
	extseqnr = 0;
	timestamp = 0;
	ssrc = 0;
	packet = 0;
	payload = 0; 
	packetlength = 0;
	payloadlength = 0;
	extid = 0;
	extension = 0;
	extensionlength = 0;
	error = 0;
	externalbuffer = false;
}